

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

void __thiscall cbor_text::cbor_text(cbor_text *this,cbor_text *other)

{
  char *pcVar1;
  cbor_text *other_local;
  cbor_text *this_local;
  
  this->l = other->l;
  if (this->l == 0) {
    this->v = (char *)0x0;
  }
  else {
    pcVar1 = (char *)operator_new__(this->l + 1);
    this->v = pcVar1;
    if (this->v == (char *)0x0) {
      this->l = 0;
    }
    else {
      memcpy(this->v,other->v,this->l);
      this->v[this->l] = '\0';
    }
  }
  return;
}

Assistant:

cbor_text::cbor_text(const cbor_text& other)
{
    l = other.l;
    if (l > 0) {
        v = new char[l+1];
        if (v == NULL) {
            l = 0;
        }
        else {
            memcpy(v, other.v, l);
            v[l] = 0;
        }
    }
    else {
        v = NULL;
    }
}